

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<solitaire::colliders::CardPositionData> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<solitaire::colliders::CardPositionData> PVar1;
  vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  local_30;
  ValueArray<solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData>
  *this_local;
  
  this_local = (ValueArray<solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData,_solitaire::colliders::CardPositionData>
                *)this;
  ValueArray<solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData,solitaire::colliders::CardPositionData>
  ::MakeVector<solitaire::colliders::CardPositionData,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
            (&local_30,in_RSI);
  ValuesIn<std::vector<solitaire::colliders::CardPositionData,std::allocator<solitaire::colliders::CardPositionData>>>
            ((testing *)this,&local_30);
  std::
  vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  ::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<solitaire::colliders::CardPositionData>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }